

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::readConstructionData
          (GridLocalPolynomial *this,istream *is,bool iomode)

{
  int *args_2;
  int *args_3;
  pointer __p;
  undefined7 in_register_00000011;
  pointer local_18;
  
  args_2 = &(this->super_BaseCanonicalGrid).num_dimensions;
  args_3 = &(this->super_BaseCanonicalGrid).num_outputs;
  if ((int)CONCAT71(in_register_00000011,iomode) == 0) {
    Utils::
    make_unique<TasGrid::SimpleConstructData,std::istream&,int&,int&,TasGrid::IO::mode_ascii_type>
              ((basic_istream<char,_std::char_traits<char>_> *)&local_18,(int *)is,args_2,
               (mode_ascii_type *)args_3);
  }
  else {
    Utils::
    make_unique<TasGrid::SimpleConstructData,std::istream&,int&,int&,TasGrid::IO::mode_binary_type>
              ((basic_istream<char,_std::char_traits<char>_> *)&local_18,(int *)is,args_2,
               (mode_binary_type *)args_3);
  }
  __p = local_18;
  local_18 = (pointer)0x0;
  ::std::
  __uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
  ::reset((__uniq_ptr_impl<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
           *)&this->dynamic_values,__p);
  ::std::
  unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>::
  ~unique_ptr((unique_ptr<TasGrid::SimpleConstructData,_std::default_delete<TasGrid::SimpleConstructData>_>
               *)&local_18);
  return;
}

Assistant:

void GridLocalPolynomial::readConstructionData(std::istream &is, bool iomode){
    if (iomode == mode_ascii)
        dynamic_values = Utils::make_unique<SimpleConstructData>(is, num_dimensions, num_outputs, IO::mode_ascii_type());
    else
        dynamic_values = Utils::make_unique<SimpleConstructData>(is, num_dimensions, num_outputs, IO::mode_binary_type());
}